

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QTimeZone::OffsetData>::reserve(QList<QTimeZone::OffsetData> *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QGenericArrayOps<QTimeZone::OffsetData> *this_00;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QTimeZone::OffsetData> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffff5c;
  OffsetData *in_stack_ffffffffffffff60;
  QArrayDataPointer<QTimeZone::OffsetData> *in_stack_ffffffffffffff68;
  OffsetData *b;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QTimeZone::OffsetData> *in_stack_ffffffffffffff80;
  qsizetype local_40;
  undefined1 local_38 [36];
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = capacity((QList<QTimeZone::OffsetData> *)0x583c15);
  qVar3 = QArrayDataPointer<QTimeZone::OffsetData>::freeSpaceAtBegin(in_stack_ffffffffffffff68);
  if (in_RSI <= qVar2 - qVar3) {
    QArrayDataPointer<QTimeZone::OffsetData>::operator->(in_RDI);
    local_38._32_4_ =
         QArrayDataPointer<QTimeZone::OffsetData>::flags
                   ((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c.i);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_00583df1;
    QArrayDataPointer<QTimeZone::OffsetData>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QTimeZone::OffsetData>::isShared
                      ((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff60);
    if (!bVar1) {
      QArrayDataPointer<QTimeZone::OffsetData>::operator->(in_RDI);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c.i);
      QArrayDataPointer<QTimeZone::OffsetData>::setFlag
                ((QArrayDataPointer<QTimeZone::OffsetData> *)0x583ccf,
                 (ArrayOptions)in_stack_ffffffffffffff5c.i);
      goto LAB_00583df1;
    }
  }
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QTimeZone::OffsetData> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  b = (OffsetData *)local_38;
  QArrayDataPointer<QTimeZone::OffsetData>::QArrayDataPointer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (AllocationOption)((ulong)b >> 0x20));
  this_00 = (QGenericArrayOps<QTimeZone::OffsetData> *)
            QArrayDataPointer<QTimeZone::OffsetData>::operator->
                      ((QArrayDataPointer<QTimeZone::OffsetData> *)b);
  QArrayDataPointer<QTimeZone::OffsetData>::operator->(in_RDI);
  QArrayDataPointer<QTimeZone::OffsetData>::begin
            ((QArrayDataPointer<QTimeZone::OffsetData> *)0x583d51);
  QArrayDataPointer<QTimeZone::OffsetData>::operator->(in_RDI);
  QArrayDataPointer<QTimeZone::OffsetData>::end
            ((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff60);
  QtPrivate::QGenericArrayOps<QTimeZone::OffsetData>::copyAppend
            (this_00,b,in_stack_ffffffffffffff60);
  pDVar4 = QArrayDataPointer<QTimeZone::OffsetData>::d_ptr
                     ((QArrayDataPointer<QTimeZone::OffsetData> *)local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff60 =
         (OffsetData *)
         QArrayDataPointer<QTimeZone::OffsetData>::operator->
                   ((QArrayDataPointer<QTimeZone::OffsetData> *)local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c.i);
    QArrayDataPointer<QTimeZone::OffsetData>::setFlag
              ((QArrayDataPointer<QTimeZone::OffsetData> *)0x583db8,
               (ArrayOptions)in_stack_ffffffffffffff5c.i);
  }
  QArrayDataPointer<QTimeZone::OffsetData>::swap
            ((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff60,
             (QArrayDataPointer<QTimeZone::OffsetData> *)
             CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
  QArrayDataPointer<QTimeZone::OffsetData>::~QArrayDataPointer
            ((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff60);
LAB_00583df1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}